

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O1

void __thiscall agge::tests::RendererTests::RenderMultilinedRasterOffset(RendererTests *this)

{
  cell *pcVar1;
  bool bVar2;
  int iVar3;
  cell *pcVar4;
  cell *pcVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  scanline_cells sVar10;
  mask<8UL> mask;
  cell cells3 [2];
  cell cells5 [3];
  cell cells4 [3];
  cell cells2 [3];
  cell cells1 [3];
  scanline_cells cells [5];
  scanline_mockup local_200;
  string local_1d8;
  LocationInfo local_1b8;
  mask<8UL> local_190;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined1 local_150 [8];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  cell local_124;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  cell local_f4;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  cell local_c4;
  undefined1 local_b8 [16];
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  cell local_94;
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_88;
  undefined8 *local_78;
  cell *local_70;
  undefined8 *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  cell *local_50;
  undefined8 *local_48;
  cell *local_40;
  
  local_200.excepted_y = -1000000;
  local_200.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_200.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_200.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_200.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_200._25_8_ = 0;
  local_200._current_y = 0x7fffffff;
  local_88.second = &local_94;
  local_b8._0_8_ = 0;
  local_a8 = 0;
  uStack_9c = 0;
  local_b8._8_8_ = 0xb00000011;
  uStack_a4 = 0xfffffffd;
  uStack_a0 = 0xd;
  local_98 = 0xfffffff2;
  local_70 = &local_c4;
  local_d8 = 0;
  uStack_cc = 0;
  local_e8 = 0xffffffff;
  uStack_e0 = 0x7000000aa;
  uStack_d4 = 0xfffffffd;
  uStack_d0 = 0x11;
  local_c8 = 0xffffff59;
  local_60 = local_150;
  local_158 = 0xffffff8b00000000;
  local_168 = 0;
  uStack_160 = 0xd00000075;
  local_50 = &local_f4;
  local_108 = 0;
  uStack_fc = 0;
  local_118 = 2;
  uStack_110 = 0x3000000ff;
  uStack_104 = 0xffffff9c;
  uStack_100 = 5;
  local_f8 = 0xffffff65;
  local_40 = &local_124;
  local_138 = 0;
  uStack_12c = 0;
  local_148 = 5;
  uStack_140 = 0x800000065;
  uStack_134 = 0xfffffffd;
  uStack_130 = 0xd;
  local_128 = 0xffffff9e;
  local_88.first = (cell *)local_b8;
  local_78 = &local_e8;
  local_68 = &local_168;
  local_58 = &local_118;
  local_48 = &local_148;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,5>
            ((mask<8ul> *)&local_190,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [5])
             &local_88,0x514);
  if (1 < local_190._height) {
    iVar6 = local_190._height + local_190._min_y;
    iVar8 = local_190._min_y + 1;
    do {
      sVar10 = mocks::mask<8UL>::operator[](&local_190,iVar8);
      pcVar5 = sVar10.second;
      pcVar4 = sVar10.first;
      bVar2 = anon_unknown_1::scanline_mockup::begin(&local_200,iVar8);
      if (bVar2) {
        if (pcVar4 != pcVar5) {
          uVar7 = 0;
LAB_0016e666:
          iVar9 = pcVar4->x;
          iVar3 = 0;
          pcVar1 = pcVar4;
          do {
            pcVar4 = pcVar1 + 1;
            iVar3 = iVar3 + pcVar1->area;
            uVar7 = uVar7 + pcVar1->cover;
            if (pcVar4 == pcVar5) break;
            pcVar1 = pcVar4;
          } while (pcVar4->x == iVar9);
          if (iVar3 != 0) {
            anon_unknown_1::scanline_mockup::add_cell(&local_200,iVar9,uVar7 * 0x200 - iVar3);
            iVar9 = iVar9 + 1;
          }
          if (pcVar4 != pcVar5) {
            iVar3 = pcVar4->x - iVar9;
            if ((uVar7 & 0x7fffff) != 0 && iVar3 != 0) {
              anon_unknown_1::scanline_mockup::add_span(&local_200,iVar9,iVar3,uVar7 * 0x200);
            }
            goto LAB_0016e666;
          }
        }
        anon_unknown_1::scanline_mockup::commit(&local_200);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < iVar6);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_1b8,&local_1d8,0x228);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,7ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [7])&DAT_001a1630,&local_200.spans_log,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.filename._M_dataplus._M_p != &local_1b8.filename.field_2) {
    operator_delete(local_1b8.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  local_200.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ =
       SUB81(local_200.spans_log.
             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_200.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
       (undefined7)
       ((ulong)local_200.spans_log.
               super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
               ._M_impl.super__Vector_impl_data._M_start >> 8);
  if (3 < local_190._height) {
    iVar6 = local_190._min_y + 3;
    do {
      sVar10 = mocks::mask<8UL>::operator[](&local_190,iVar6);
      pcVar5 = sVar10.second;
      pcVar4 = sVar10.first;
      bVar2 = anon_unknown_1::scanline_mockup::begin(&local_200,iVar6);
      if (bVar2) {
        if (pcVar4 != pcVar5) {
          uVar7 = 0;
LAB_0016e7c1:
          iVar8 = pcVar4->x;
          iVar9 = 0;
          pcVar1 = pcVar4;
          do {
            pcVar4 = pcVar1 + 1;
            iVar9 = iVar9 + pcVar1->area;
            uVar7 = uVar7 + pcVar1->cover;
            if (pcVar4 == pcVar5) break;
            pcVar1 = pcVar4;
          } while (pcVar4->x == iVar8);
          if (iVar9 != 0) {
            anon_unknown_1::scanline_mockup::add_cell(&local_200,iVar8,uVar7 * 0x200 - iVar9);
            iVar8 = iVar8 + 1;
          }
          if (pcVar4 != pcVar5) {
            iVar9 = pcVar4->x - iVar8;
            if ((uVar7 & 0x7fffff) != 0 && iVar9 != 0) {
              anon_unknown_1::scanline_mockup::add_span(&local_200,iVar8,iVar9,uVar7 * 0x200);
            }
            goto LAB_0016e7c1;
          }
        }
        anon_unknown_1::scanline_mockup::commit(&local_200);
      }
      iVar6 = iVar6 + 2;
    } while (iVar6 < local_190._height + local_190._min_y);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_1b8,&local_1d8,0x235);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,2ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [2])&DAT_001a1b00,&local_200.spans_log,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.filename._M_dataplus._M_p != &local_1b8.filename.field_2) {
    operator_delete(local_1b8.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_190._cells.
      super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190._cells.
                    super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_200.spans_log.
      super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.spans_log.
                    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

scanline_mockup(bool inprogress = true)
					: excepted_y(-1000000), _inprogress(inprogress), _current_y(0x7fffffff)
				{	}